

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverlapGraph.cpp
# Opt level: O2

int __thiscall dgrminer::OverlapGraph::computeSupport(OverlapGraph *this)

{
  _Rb_tree_node_base *__k;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  OverlapGraph *pOVar1;
  const_iterator __position;
  int iVar2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  int result;
  vector<int,_std::allocator<int>_> max_clique_data;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  nodeList;
  CGraphIO gio;
  _Rb_tree_color local_124;
  OverlapGraph *local_120;
  undefined1 local_118 [8];
  pointer piStack_110;
  _Base_ptr local_108;
  _Rb_tree_node_base *local_100;
  _Rb_tree_node_base *local_f8;
  size_t local_f0;
  _Rb_tree_header *local_e8;
  _Rb_tree_node_base *local_e0;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_d8;
  undefined1 local_a8 [72];
  pointer local_60;
  const_iterator cStack_58;
  pointer local_50;
  pointer pdStack_48;
  pointer local_40;
  pointer pdStack_38;
  
  local_a8._0_8_ = &PTR__CGraphIO_0017cd60;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_a8._56_8_ = (pointer)0x0;
  local_a8._64_8_ = (pointer)0x0;
  local_60 = (pointer)0x0;
  cStack_58._M_current = (int *)0x0;
  local_50 = (pointer)0x0;
  pdStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  pdStack_38 = (pointer)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d8._M_impl.super__Rb_tree_header._M_header;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffff00000000);
  local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)(local_a8 + 0x18),(int *)local_118);
  local_e0 = &(this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_e8 = &(this->vertices)._M_t._M_impl.super__Rb_tree_header;
  local_120 = this;
  for (p_Var5 = (this->adjacencyLists)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pOVar1 = local_120, p_Var5 != local_e0;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    piStack_110 = (pointer)((ulong)piStack_110 & 0xffffffff00000000);
    local_108 = (_Base_ptr)0x0;
    local_f0 = 0;
    local_100 = (_Rb_tree_node_base *)&piStack_110;
    local_f8 = (_Rb_tree_node_base *)&piStack_110;
    std::
    __set_difference<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((local_120->vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,local_e8,
               *(undefined8 *)(p_Var5 + 2),&p_Var5[1]._M_left,local_118,
               (_Rb_tree_node_base *)&piStack_110);
    __k = p_Var5 + 1;
    for (p_Var4 = local_100; p_Var4 != (_Rb_tree_node_base *)&piStack_110;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      local_124 = p_Var4[1]._M_color;
      if ((int)local_124 < (int)__k->_M_color) {
        pmVar3 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&local_d8,(key_type *)__k);
        std::vector<int,_std::allocator<int>_>::push_back(pmVar3,(value_type_conflict *)&local_124);
        pmVar3 = std::
                 map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                               *)&local_d8,(key_type *)&local_124);
        std::vector<int,_std::allocator<int>_>::push_back(pmVar3,(value_type_conflict *)__k);
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_118);
  }
  iVar2 = 0;
  while (__position._M_current = cStack_58._M_current, local_118._0_4_ = iVar2,
        (ulong)(long)iVar2 < (pOVar1->vertices)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    pmVar3 = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                           *)&local_d8,(key_type *)local_118);
    __first._M_current =
         (pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_start;
    pmVar3 = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                           *)&local_d8,(key_type *)local_118);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)&local_60,__position,__first,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               (pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    local_124 = (_Rb_tree_color)((ulong)((long)cStack_58._M_current - (long)local_60) >> 2);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)(local_a8 + 0x18),(int *)&local_124);
    iVar2 = local_118._0_4_ + 1;
  }
  CGraphIO::CalculateVertexDegrees((CGraphIO *)local_a8);
  if (pOVar1->heuristic == true) {
    iVar2 = maxCliqueHeu((CGraphIO *)local_a8);
  }
  else {
    local_118 = (undefined1  [8])0x0;
    piStack_110 = (pointer)0x0;
    local_108 = (_Base_ptr)0x0;
    iVar2 = maxClique((CGraphIO *)local_a8,0,(vector<int,_std::allocator<int>_> *)local_118);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_118);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_d8);
  CGraphIO::~CGraphIO((CGraphIO *)local_a8);
  return iVar2;
}

Assistant:

int OverlapGraph::computeSupport() {
		// create inverse graph and calculate maximum clique
		CGraphIO gio;
	  	map<int,vector<int> > nodeList;

		gio.m_vi_Vertices.push_back(gio.m_vi_Edges.size());

		for (auto const &adjacencyList : adjacencyLists) {
		  	std::set<int> inverseResult;

		  	std::set_difference(
		  		vertices.begin(),
			    vertices.end(),
			    adjacencyList.second.begin(),
			    adjacencyList.second.end(),
			    std::inserter(inverseResult, inverseResult.end())
		  	);

		  	for (auto result : inverseResult) {
			  	if (result < adjacencyList.first) {
				  	nodeList[adjacencyList.first].push_back(result);
				  	nodeList[result].push_back(adjacencyList.first);
			  	}
		  	}
		}

	  	for(int i=0; i < vertices.size(); ++i) {
		  	gio.m_vi_Edges.insert(gio.m_vi_Edges.end(),nodeList[i].begin(),nodeList[i].end());
		  	gio.m_vi_Vertices.push_back(gio.m_vi_Edges.size());
		}

		gio.CalculateVertexDegrees();

		if (heuristic){
		  	return maxCliqueHeu(gio);
		}

		std::vector<int> max_clique_data;
		return maxClique(gio, 0, max_clique_data);
	}